

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O3

ssize_t __thiscall iqnet::Socket::send(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  network_error *this_00;
  undefined4 in_register_00000034;
  string local_40;
  
  sVar1 = ::send(this->sock,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0x4000);
  if ((int)sVar1 != -1) {
    return (long)(int)sVar1;
  }
  this_00 = (network_error *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Socket::send","");
  network_error::network_error(this_00,&local_40,true,0);
  __cxa_throw(this_00,&network_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t Socket::send( const char* data, size_t len )
{
  int ret = ::send( sock, data, static_cast<int>(len), IQXMLRPC_NOPIPE);

  if( ret == -1 )
    throw network_error( "Socket::send" );

  return static_cast<size_t>(ret);
}